

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void glist_doreload(_glist *gl,t_symbol *name,t_symbol *dir,t_gobj *except)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  t_symbol *ptVar4;
  _glist *p_Var5;
  bool bVar6;
  int remakeit;
  int found;
  int hadwindow;
  t_gobj *g;
  t_gobj *except_local;
  t_symbol *dir_local;
  t_symbol *name_local;
  _glist *gl_local;
  
  uVar1 = *(ushort *)&gl->field_0xe8;
  bVar2 = false;
  for (_found = (_glist *)gl->gl_list; _found != (_glist *)0x0;
      _found = (_glist *)(_found->gl_obj).te_g.g_next) {
    bVar6 = false;
    if ((_found != (_glist *)except) && (bVar6 = false, (_found->gl_obj).te_g.g_pd == canvas_class))
    {
      iVar3 = canvas_isabstraction(_found);
      bVar6 = false;
      if ((iVar3 != 0) && (bVar6 = false, _found->gl_name == name)) {
        ptVar4 = canvas_getdir(_found);
        bVar6 = ptVar4 == dir;
      }
    }
    if ((_found->gl_obj).te_g.g_pd == clone_class) {
      iVar3 = clone_match((t_pd *)_found,name,dir);
      if (iVar3 != 0) {
        bVar6 = true;
      }
    }
    if (bVar6) {
      canvas_create_editor(gl);
      if ((*(ushort *)&gl->field_0xe8 & 1) == 0) {
        p_Var5 = glist_getcanvas(gl);
        canvas_vis(p_Var5,1.0);
      }
      if (!bVar2) {
        glist_noselect(gl);
        bVar2 = true;
      }
      glist_select(gl,(t_gobj *)_found);
    }
  }
  if (bVar2) {
    canvas_cut(gl);
    canvas_undo_undo(gl);
    canvas_undo_rebranch(gl);
    glist_noselect(gl);
  }
  _found = (_glist *)gl->gl_list;
  do {
    if (_found == (_glist *)0x0) {
      if (((uVar1 & 1) == 0) && ((*(ushort *)&gl->field_0xe8 & 1) != 0)) {
        p_Var5 = glist_getcanvas(gl);
        canvas_vis(p_Var5,0.0);
      }
      return;
    }
    if ((_found != (_glist *)except) && ((_found->gl_obj).te_g.g_pd == canvas_class)) {
      iVar3 = canvas_isabstraction(_found);
      if ((iVar3 != 0) && (_found->gl_name == name)) {
        ptVar4 = canvas_getdir(_found);
        if (ptVar4 == dir) goto LAB_0015bcdd;
      }
      glist_doreload(_found,name,dir,except);
    }
LAB_0015bcdd:
    _found = (_glist *)(_found->gl_obj).te_g.g_next;
  } while( true );
}

Assistant:

static void glist_doreload(t_glist *gl, t_symbol *name, t_symbol *dir,
    t_gobj *except)
{
    t_gobj *g;
    int hadwindow = gl->gl_havewindow;
    int found = 0;
        /* to optimize redrawing we select all objects that need to be updated
           and redraw (cut+undo) them together. Then we look for sub-patches that may have
           more of the same... */
    for (g = gl->gl_list; g; g = g->g_next)
    {
            /* remake the object if it's an abstraction that appears to have
               been loaded from the file we just saved */
        int remakeit = (g != except && pd_class(&g->g_pd) == canvas_class &&
            canvas_isabstraction((t_canvas *)g) &&
                ((t_canvas *)g)->gl_name == name &&
                    canvas_getdir((t_canvas *)g) == dir);
            /* also remake it if it's a "clone" with that name */
        if (pd_class(&g->g_pd) == clone_class &&
            clone_match(&g->g_pd, name, dir))
        {
                /* LATER try not to remake the one that equals "except" */
            remakeit = 1;
        }
        if (remakeit)
        {
                /* Bugfix for cases where canvas_vis doesn't actually create a
                   new editor. We need to fix canvas_vis so that the bug
                   doesn't get triggered. But since we know this fixes a
                   regression we'll keep this as a point in the history as we
                   fix canvas_vis. Once that's done we can remove this call. */
            canvas_create_editor(gl);

            if (!gl->gl_havewindow)
            {
                canvas_vis(glist_getcanvas(gl), 1);
            }
            if (!found)
            {
                glist_noselect(gl);
                found = 1;
            }
            glist_select(gl, g);
        }
    }
        /* cut all selected (matched) objects and undo, to reinstantiate them */
    if (found)
    {
        canvas_cut(gl);
        canvas_undo_undo(gl);
        canvas_undo_rebranch(gl);
        glist_noselect(gl);
    }

        /* now iterate over all the sub-patches... */
    for (g = gl->gl_list; g; g = g->g_next)
    {
        if (g != except && pd_class(&g->g_pd) == canvas_class &&
            (!canvas_isabstraction((t_canvas *)g) ||
                 ((t_canvas *)g)->gl_name != name ||
                 canvas_getdir((t_canvas *)g) != dir)
           )
                glist_doreload((t_canvas *)g, name, dir, except);
    }
    if (!hadwindow && gl->gl_havewindow)
        canvas_vis(glist_getcanvas(gl), 0);
}